

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O0

ostream * __thiscall beast::Journal::ScopedStream::operator<<(ScopedStream *this,char **t)

{
  char **t_local;
  ScopedStream *this_local;
  
  std::operator<<((ostream *)&this->m_ostream,*t);
  return (ostream *)&this->m_ostream;
}

Assistant:

std::ostream&
Journal::ScopedStream::operator<< (T const& t) const
{
    m_ostream << t;
    return m_ostream;
}